

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,1,2,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  pair<unsigned_long,_unsigned_long> *ppVar5;
  pair<unsigned_long,_unsigned_long> *ppVar6;
  unsigned_long *puVar7;
  comm *pcVar8;
  unsigned_long uVar9;
  _Elt_pointer ppVar10;
  _Elt_pointer ppVar11;
  _Elt_pointer ppVar12;
  _Elt_pointer ppVar13;
  _Elt_pointer ppVar14;
  _Map_pointer pppVar15;
  _Map_pointer pppVar16;
  pair<unsigned_long,_unsigned_long> *ppVar17;
  pointer puVar18;
  comm *pcVar19;
  comm *pcVar20;
  _Elt_pointer ppVar21;
  unsigned_long uVar22;
  _Elt_pointer ppVar23;
  _Map_pointer pppVar24;
  long lVar25;
  ulong uVar26;
  unsigned_long uVar27;
  unsigned_long uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  _Map_pointer pppVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  _Elt_pointer ppVar36;
  ulong *puVar37;
  bool bVar38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1f8;
  _Elt_pointer local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1a0;
  _Elt_pointer local_198;
  _Elt_pointer ppStack_190;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_180;
  _Elt_pointer local_178;
  _Elt_pointer ppStack_170;
  comm *local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  _Map_pointer local_140;
  _Elt_pointer local_138;
  _Elt_pointer ppStack_130;
  pair<unsigned_long,_unsigned_long> local_128;
  _Elt_pointer local_118;
  size_t local_110;
  unsigned_long local_108;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_100;
  size_type local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Map_pointer local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1a0 = right_nsv;
  local_180 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_110 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1f8,0);
  local_e8 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  local_160 = comm;
  uVar9 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_e8,comm);
  lVar33 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar33 != 0) {
    lVar33 = lVar33 >> 3;
    local_198 = (_Elt_pointer)(uVar9 - 1);
    ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00135eba:
    do {
      pppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar13) {
        uVar26 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar33 + -1];
        ppVar10 = ppVar13;
        if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar11) {
          if (uVar26 < local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar11);
            ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar11 + 0x20;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11 + 0x1f;
            ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar11;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_00135eba;
          }
        }
        else if (uVar26 < local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_00135eba;
        }
      }
      while( true ) {
        uVar26 = (long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar11 >>
                 4;
        puVar18 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (((long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar10 >> 4) +
            uVar26 + ((((ulong)((long)pppVar15 -
                               (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar15 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar11) {
          ppVar13 = pppVar15[-1] + 0x20;
        }
        uVar28 = puVar18[lVar33 + -1];
        if (uVar28 != ppVar13[-1].first) break;
        uVar34 = uVar26 - 1;
        if ((long)uVar26 < 1) {
          uVar26 = (long)uVar34 >> 5;
LAB_00135fbc:
          pppVar24 = pppVar15 + uVar26;
          ppVar12 = *pppVar24;
          ppVar13 = ppVar12 + uVar34 + uVar26 * -0x20;
        }
        else {
          if (0x20 < uVar26) {
            uVar26 = uVar34 >> 5;
            goto LAB_00135fbc;
          }
          ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar24 = pppVar15;
          ppVar12 = ppVar11;
        }
        if (ppVar13 == ppVar12) {
          ppVar13 = pppVar24[-1] + 0x20;
        }
        if (uVar28 != ppVar13[-1].first) break;
        if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar11) {
          operator_delete(ppVar11);
          pppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar11 + 0x20;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11 + 0x1f;
          ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar11;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar15;
        }
        else {
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((long)local_198 + lVar33);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar18[lVar33 + -1];
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1f8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar33 = lVar33 + -1;
      ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (lVar33 != 0);
  }
  local_58.current._M_cur = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_158,&local_58,&local_78,(allocator_type *)&local_98);
  pvVar4 = *(void **)local_180;
  *(pointer *)local_180 =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_180 + 8) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_180 + 0x10) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = (_Elt_pointer)left_nsv;
  if ((pvVar4 != (void *)0x0) &&
     (operator_delete(pvVar4),
     local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar32 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar24 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_138 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_178 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar26 = ((long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x20;
  local_1a8 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  pppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (uVar26 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 2, indexing_type = 0]"
                 );
  }
  for (; pppVar15 < pppVar32; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
  }
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar24;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_178;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = local_1a8;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = local_138;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar34 = 0;
    do {
      ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar31 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar34];
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar11) {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar31
               ) break;
            operator_delete(ppVar11);
            ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar11 + 0x20;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11 + 0x1f;
            ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar11;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar31)
            break;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10);
        ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10) {
          do {
            uVar28 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[uVar34];
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar11) {
              if (uVar28 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                            first) break;
              operator_delete(ppVar11);
              ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar11 + 0x20;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11 + 0x1f;
              ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar11;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar28 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar10);
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar34 + uVar9);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar34];
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1f8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar34 = (long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar38 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_178 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1f8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1f8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_140 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_1a8 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_180,*(undefined8 *)(local_180 + 8));
  pppVar24 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar33 = (long)ppVar11 - (long)local_178;
  local_178 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_108 = (local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar33 = (lVar33 >> 4) + ((long)ppVar10 - (long)local_1a8 >> 4) +
           (((uVar34 >> 3) - 1) + (ulong)bVar38) * 0x20;
  ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_130 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar10 = (_Elt_pointer)local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  pppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar19 = local_160;
  if (lVar33 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 2, indexing_type = 0]"
                 );
  }
  for (; local_1a8 = ppVar10, local_138 = ppVar11, local_160 = pcVar19, pppVar15 < pppVar24;
      pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar11 = local_138;
    ppVar10 = local_1a8;
    pcVar19 = local_160;
  }
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_178;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = local_138;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_130;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_1a8;
  if (lVar33 + uVar26 != *(long *)(local_180 + 8) - *(long *)local_180 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 2, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_158,&local_108,1,pcVar19);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)pcVar19->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_e0);
  local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)pcVar19->m_size,(value_type_conflict *)&local_e0,
             (allocator_type *)&local_c8);
  pcVar8 = local_160;
  ppVar11 = local_198;
  iVar2 = pcVar19->m_rank;
  lVar33 = (long)iVar2;
  if (0 < lVar33) {
    ppVar17 = *(pair<unsigned_long,_unsigned_long> **)
               ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar33 * 8 + -8);
    local_1a8 = *(_Elt_pointer *)local_180;
    local_178 = (_Elt_pointer)
                local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_138 = (_Elt_pointer)
                local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar28 = 0;
    lVar25 = lVar33;
    do {
      uVar22 = uVar28;
      if (((lVar25 < lVar33) && (uVar28 != 0)) &&
         (uVar22 = uVar28 - 1, ppVar17 < *(_Map_pointer)((long)local_1a8 + (uVar28 - 1) * 2 * 8))) {
        uVar22 = uVar28;
      }
      uVar34 = uVar28 + 1;
      if (uVar28 + 1 < uVar26) {
        uVar34 = uVar26;
      }
      lVar1 = lVar25 + -1;
      ppVar5 = *(pair<unsigned_long,_unsigned_long> **)
                ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1 * 8);
      puVar37 = (ulong *)(uVar28 * 0x10 + *(long *)local_180);
      uVar27 = uVar28 - 1;
      do {
        uVar28 = uVar34 - 1;
        if ((1 - uVar34) + uVar27 == -1) break;
        uVar28 = uVar27 + 1;
        ppVar6 = (pair<unsigned_long,_unsigned_long> *)*puVar37;
        puVar37 = puVar37 + 2;
        uVar27 = uVar28;
      } while (ppVar5 <= ppVar6);
      if (ppVar5 <= ppVar17) {
        *(unsigned_long *)
         ((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1 * 8) = (uVar28 - uVar22) + 1;
        *(unsigned_long *)
         ((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1 * 8) = uVar22;
        ppVar17 = ppVar5;
        if (*(ulong *)((long)local_158.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar1 * 8) < local_108)
        break;
      }
      bVar38 = 1 < lVar25;
      lVar25 = lVar1;
    } while (bVar38);
  }
  iVar3 = local_160->m_size;
  if (iVar2 < iVar3 + -1) {
    lVar25 = *(long *)local_180;
    uVar34 = ((unsigned_long *)
             ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar33];
    lVar33 = lVar33 + 1;
    uVar31 = (*(long *)(local_180 + 8) - lVar25 >> 4) - 1;
    do {
      uVar35 = local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar33];
      uVar30 = uVar31;
      if (uVar26 < uVar31) {
        puVar37 = (ulong *)(uVar31 * 0x10 + lVar25);
        uVar29 = uVar31;
        do {
          uVar30 = uVar29;
          if (*puVar37 < uVar35) break;
          uVar29 = uVar29 - 1;
          puVar37 = puVar37 + -2;
          uVar30 = uVar26;
        } while (uVar26 < uVar29);
      }
      if (uVar35 <= uVar34) {
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar33] = (uVar31 - uVar30) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar33] = uVar30;
        uVar34 = uVar35;
        if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar33] < local_108) break;
      }
      lVar33 = lVar33 + 1;
      uVar31 = uVar30;
    } while (iVar3 != (int)lVar33);
  }
  mxx::all2all<unsigned_long>(&local_e0,&local_98,local_160);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_e0);
  local_118 = (_Elt_pointer)
              (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1] +
              local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_100,(size_type)local_118,(allocator_type *)&local_128);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_180,&local_98,&local_b0,
             local_100.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_e0,&local_c8,pcVar8);
  local_1a8 = (_Elt_pointer)
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[pcVar8->m_rank];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar11,local_e8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_1a0,local_e8);
  pppVar32 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar24 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_170 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar11 = local_198;
  for (pppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node; local_198 = ppVar11,
      pppVar15 < pppVar32; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar11 = local_198;
  }
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar24;
  lVar33 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = local_178;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_170;
  if (lVar33 != 0) {
    lVar33 = lVar33 >> 3;
    local_178 = (_Elt_pointer)(uVar9 - 1);
    do {
      ppVar10 = (_Elt_pointer)((long)&local_178->first + lVar33);
      lVar33 = lVar33 + -1;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar18 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar26 = puVar18[lVar33];
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar13) {
            ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar17[0x1f].first <= uVar26) {
              if (uVar26 == ppVar17[0x1f].first) {
                (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar11)->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start[ppVar17[0x1f].second - uVar9] =
                     (unsigned_long)ppVar10;
                operator_delete(ppVar13);
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              break;
            }
            (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar11)->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar17[0x1f].second - uVar9] = (unsigned_long)ppVar10;
            operator_delete(ppVar13);
            ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar13 + 0x20;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13 + 0x1f;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar13;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar26) {
              if (uVar26 == local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
                (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar11)->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start
                [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] =
                     (unsigned_long)ppVar10;
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
              break;
            }
            (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppVar11)->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] =
                 (unsigned_long)ppVar10;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_128.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar33];
      local_128.second = (unsigned_long)ppVar10;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1f8,&local_128);
      }
      else {
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_128.first;
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = (unsigned_long)ppVar10
        ;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar33 != 0);
  }
  ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_1a8 != (_Elt_pointer)0x0) {
    ppVar10 = (_Elt_pointer)0x0;
    local_178 = (_Elt_pointer)((long)local_1a8 << 4);
    do {
      if (ppVar11 == local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar7 = &(local_100.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first;
      ppVar12 = local_178 + ~(ulong)ppVar10;
      uVar28 = *(unsigned_long *)((long)&local_178[~(ulong)ppVar10].second + (long)puVar7);
      ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
      do {
        uVar26 = *(ulong *)((long)&ppVar12->first + (long)puVar7);
        if (ppVar11 == ppVar13) {
          ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppVar17[0x1f].first <= uVar26) {
            if (uVar26 == ppVar17[0x1f].first) {
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198->first)->
              _M_impl).super__Vector_impl_data._M_start[ppVar17[0x1f].second - uVar9] = uVar28;
              operator_delete(ppVar13);
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            break;
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar17[0x1f].second - uVar9] = uVar28;
          operator_delete(ppVar13);
          ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar13 + 0x20;
          ppVar11 = ppVar13 + 0x1f;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar13;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar11[-1].first <= uVar26) {
            if (uVar26 == ppVar11[-1].first) {
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198->first)->
              _M_impl).super__Vector_impl_data._M_start[ppVar11[-1].second - uVar9] = uVar28;
              ppVar11 = ppVar11 + -1;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
            }
            break;
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar11[-1].second - uVar9] = uVar28;
          ppVar11 = ppVar11 + -1;
        }
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
      } while (ppVar11 != local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur);
      ppVar10 = (_Elt_pointer)((long)&ppVar10->first + 1);
    } while (ppVar10 != local_1a8);
  }
  pppVar32 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar24 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (ppVar11 != local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar18 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198->first)->
              _M_impl).super__Vector_impl_data._M_start;
    ppVar12 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
    pppVar16 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (ppVar11 == ppVar12) {
        ppVar12 = pppVar16[-1];
        pppVar16 = pppVar16 + -1;
        puVar18[ppVar12[0x1f].second - uVar9] = local_110;
        ppVar11 = ppVar12 + 0x20;
      }
      else {
        puVar18[ppVar11[-1].second - uVar9] = local_110;
      }
      ppVar11 = ppVar11 + -1;
      ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
    } while (ppVar11 != local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_198 = ppVar13, pppVar15 < pppVar32; pppVar15 = pppVar15 + 1) {
    operator_delete(pppVar15[1]);
    ppVar13 = local_198;
  }
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar10;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar24;
  puVar18 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar18) {
    uVar26 = 0;
    do {
      local_198 = (_Elt_pointer)(uVar26 + uVar9);
      ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar11) {
            ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar17[0x1f].first <= puVar18[uVar26]) break;
            (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar17[0x1f].second - uVar9] =
                 (unsigned_long)local_198;
            ppVar10 = ppVar17 + 0x20;
          }
          else {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar18[uVar26]) break;
            (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] =
                 (unsigned_long)local_198;
            ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar28 = ppVar10[-1].first;
          uVar22 = ppVar10[-1].second;
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar11)
          goto LAB_00136c7a;
          while( true ) {
            operator_delete(ppVar11);
            ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar11 + 0x20;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11 + 0x1f;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar11;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00136cb6;
              if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar11) break;
              if (uVar28 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_00136cad;
              (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start
              [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] =
                   uVar22;
LAB_00136c7a:
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar28 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) break;
            (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar9] =
                 uVar22;
          }
LAB_00136cad:
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        } while( true );
      }
LAB_00136cb6:
      local_128.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar26];
      local_128.second = (unsigned_long)local_198;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1f8,&local_128);
      }
      else {
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_128.first;
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)local_198;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar26 = uVar26 + 1;
      puVar18 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar26 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar18 >> 3
                             ));
  }
  ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar10 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_118 != local_1a8) {
    local_160 = (comm *)((long)local_118 - (long)local_1a8);
    local_118 = (_Elt_pointer)((long)&local_118[-1].second + 7);
    pcVar19 = (comm *)0x0;
    ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar12 = local_1a8;
LAB_00136d5f:
    if (ppVar13 != ppVar11) {
      local_138 = (_Elt_pointer)((long)&pcVar19->_vptr_comm + (long)&ppVar12->first);
      local_178 = (_Elt_pointer)((long)local_138 * 0x10);
      local_198 = (_Elt_pointer)
                  local_100.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_138].second;
      ppVar17 = local_100.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_138;
      ppVar12 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00136d9a:
      if (ppVar13 == ppVar12) {
        ppVar5 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar5[0x1f].first <= ppVar17->first) goto LAB_00136efd;
        (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar5[0x1f].second - uVar9] = (unsigned_long)local_198;
        uVar28 = ppVar5[0x1f].first;
        uVar22 = ppVar5[0x1f].second;
        operator_delete(ppVar12);
        ppVar12 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
        ppVar13 = ppVar12 + 0x1f;
        ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar13[-1].first <= ppVar17->first) goto LAB_00136efd;
        (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar13[-1].second - uVar9] = (unsigned_long)local_198;
        uVar28 = ppVar13[-1].first;
        uVar22 = ppVar13[-1].second;
        ppVar13 = ppVar13 + -1;
      }
      ppVar10 = ppVar13;
      local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13;
      if (ppVar13 != ppVar11) {
        do {
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13;
          if (ppVar13 == ppVar12) {
            if (uVar28 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) goto LAB_00136eec;
            (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar9] =
                 uVar22;
            operator_delete(ppVar12);
            ppVar12 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar12 + 0x20;
            ppVar13 = ppVar12 + 0x1f;
            ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar12;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar28 != ppVar13[-1].first) goto LAB_00136eec;
            (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar13[-1].second - uVar9] = uVar22;
            ppVar13 = ppVar13 + -1;
          }
          ppVar10 = ppVar13;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13;
          if (ppVar13 == ppVar11) break;
        } while( true );
      }
      goto LAB_00136efd;
    }
  }
LAB_001370b1:
  if (ppVar10 == ppVar11) {
LAB_0013722e:
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)local_180,&local_100);
    if (local_100.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_100.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Elt_pointer)
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Elt_pointer)
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Elt_pointer)
        local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
      operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base(&local_1f8);
    return;
  }
  local_198 = (_Elt_pointer)
              (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
  pppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_001370df:
  puVar18 = (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pppVar24 = pppVar15;
  ppVar23 = ppVar13;
  ppVar12 = ppVar10;
  do {
    uVar31 = (long)ppVar12 - (long)ppVar23 >> 4;
    uVar26 = uVar31 - 1;
    uVar35 = (long)uVar26 >> 5;
    uVar34 = uVar35;
    if ((long)uVar31 < 1) {
LAB_00137116:
      ppVar36 = pppVar24[uVar34] + uVar26 + uVar34 * -0x20;
    }
    else {
      if (0x20 < uVar31) {
        uVar34 = uVar26 >> 5;
        goto LAB_00137116;
      }
      ppVar36 = ppVar12 + -1;
    }
    if (ppVar36 == ppVar11) goto LAB_001371e0;
    ppVar36 = ppVar10;
    if (ppVar10 == ppVar13) {
      ppVar36 = pppVar15[-1] + 0x20;
    }
    if ((long)uVar31 < 1) {
LAB_0013716a:
      pppVar32 = pppVar24 + uVar35;
      ppVar21 = *pppVar32;
      ppVar14 = ppVar21 + uVar26 + uVar35 * -0x20;
    }
    else {
      if (0x20 < uVar31) {
        uVar35 = uVar26 >> 5;
        goto LAB_0013716a;
      }
      ppVar14 = ppVar12 + -1;
      ppVar21 = ppVar23;
      pppVar32 = pppVar24;
    }
    if (ppVar14 == ppVar21) {
      ppVar14 = pppVar32[-1] + 0x20;
    }
    if (ppVar36[-1].first != ppVar14[-1].first) goto LAB_001371e0;
    if (ppVar12 == ppVar23) {
      ppVar23 = pppVar24[-1];
      pppVar24 = pppVar24 + -1;
      ppVar12 = ppVar23 + 0x20;
    }
    ppVar36 = ppVar10;
    if (ppVar10 == ppVar13) {
      ppVar36 = pppVar15[-1] + 0x20;
    }
    ppVar12 = ppVar12 + -1;
    ppVar14 = ppVar12;
    if (ppVar12 == ppVar23) {
      ppVar14 = pppVar24[-1] + 0x20;
    }
    puVar18[ppVar14[-1].second - uVar9] = ppVar36[-1].second;
  } while( true );
LAB_00136eec:
  ppVar10 = ppVar13;
  if (ppVar13 == ppVar11) goto LAB_00136efd;
  goto LAB_00136d9a;
LAB_00136efd:
  pcVar8 = local_160;
  ppVar12 = local_1a8;
  if (ppVar13 != ppVar11) {
    ppVar23 = ppVar13;
    if (ppVar13 == local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar23 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&local_178->first +
         (long)&(local_100.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar23[-1].first) {
      ppVar13 = ppVar10;
      ppVar23 = local_138;
      if (((comm *)((long)&pcVar19->_vptr_comm + 1U) < local_160) &&
         (*(long *)((long)&local_178->first +
                   (long)&(local_100.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first) ==
          *(long *)((long)&local_178->first +
                   (long)&local_100.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].first))) {
        ppVar17 = local_100.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  (long)&pcVar19->_vptr_comm + (long)&local_1a8->first + 2;
        do {
          pcVar20 = pcVar19;
          ppVar23 = local_118;
          if (local_160 <= (comm *)((long)&pcVar20->_vptr_comm + 2U)) goto LAB_00136fcc;
          ppVar5 = ppVar17 + -1;
          pcVar19 = (comm *)((long)&pcVar20->_vptr_comm + 1);
          puVar7 = &ppVar17->first;
          ppVar17 = ppVar17 + 1;
        } while (ppVar5->first == *puVar7);
        ppVar23 = (_Elt_pointer)((long)&local_1a8->first + (long)&pcVar19->_vptr_comm);
LAB_00136fcc:
        pcVar19 = (comm *)((long)&pcVar20->_vptr_comm + 1);
      }
      while (ppVar10 = ppVar13, ppVar13 != ppVar11) {
        if (ppVar13 == local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first !=
              local_100.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)ppVar23].first) break;
          (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar9] =
               local_100.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)ppVar23].second;
          operator_delete(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar13[-1].first !=
              local_100.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)ppVar23].first) break;
          ppVar10 = ppVar13 + -1;
          ppVar13 = ppVar13 + -1;
          (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar10->second - uVar9] =
               local_100.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)ppVar23].second;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13;
        }
      }
    }
  }
  pcVar19 = (comm *)((long)&pcVar19->_vptr_comm + 1);
  if (pcVar8 <= pcVar19) goto LAB_001370b1;
  goto LAB_00136d5f;
LAB_001371e0:
  if (ppVar10 == ppVar13) {
    ppVar10 = pppVar15[-1] + 0x20;
  }
  *(size_t *)((long)local_198 + (ppVar10[-1].second - uVar9) * 8) = local_110;
  if (ppVar12 == ppVar23) {
    ppVar23 = pppVar24[-1];
    pppVar24 = pppVar24 + -1;
    ppVar12 = ppVar23 + 0x20;
  }
  ppVar10 = ppVar12 + -1;
  pppVar15 = pppVar24;
  ppVar13 = ppVar23;
  if (ppVar10 == ppVar11) goto LAB_0013722e;
  goto LAB_001370df;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}